

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_andis_(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  
  uVar1 = ctx->opcode;
  tcg_gen_andi_i64_ppc64
            (ctx->uc->tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)),(ulong)(uVar1 << 0x10));
  gen_set_Rc0(ctx,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
  return;
}

Assistant:

static void gen_andis_(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_andi_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                    UIMM(ctx->opcode) << 16);
    gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
}